

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rendsig.c
# Opt level: O3

int32 duh_sigrenderer_generate_samples
                (DUH_SIGRENDERER *sigrenderer,double volume,double delta,int32 size,
                sample_t_conflict **samples)

{
  int32 iVar1;
  long lVar2;
  int32 iVar3;
  
  iVar3 = 0;
  if (sigrenderer != (DUH_SIGRENDERER *)0x0) {
    iVar1 = (*sigrenderer->desc->sigrenderer_generate_samples)
                      (sigrenderer->sigrenderer,volume,delta,size,samples);
    iVar3 = 0;
    if (iVar1 != 0) {
      if (sigrenderer->callback != (DUH_SIGRENDERER_SAMPLE_ANALYSER_CALLBACK)0x0) {
        (*sigrenderer->callback)(sigrenderer->callback_data,samples,sigrenderer->n_channels,iVar1);
      }
      lVar2 = (long)iVar1 * (long)(delta * 65536.0 + 0.5) + (long)sigrenderer->subpos;
      sigrenderer->pos = sigrenderer->pos + (int)((ulong)lVar2 >> 0x10);
      sigrenderer->subpos = (uint)lVar2 & 0xffff;
      iVar3 = iVar1;
    }
  }
  return iVar3;
}

Assistant:

int32 DUMBEXPORT duh_sigrenderer_generate_samples(
	DUH_SIGRENDERER *sigrenderer,
	double volume, double delta,
	int32 size, sample_t **samples
)
{
	int32 rendered;
	LONG_LONG t;

	if (!sigrenderer) return 0;

	rendered = (*sigrenderer->desc->sigrenderer_generate_samples)
				(sigrenderer->sigrenderer, volume, delta, size, samples);

	if (rendered) {
		if (sigrenderer->callback)
			(*sigrenderer->callback)(sigrenderer->callback_data,
				(const sample_t *const *)samples, sigrenderer->n_channels, rendered);

		t = sigrenderer->subpos + (LONG_LONG)(delta * 65536.0 + 0.5) * rendered;

		sigrenderer->pos += (int32)(t >> 16);
		sigrenderer->subpos = (int)t & 65535;
	}

	return rendered;
}